

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O2

void __thiscall Lodtalk::ClassBuilder::createMetaclassMethodDict(ClassBuilder *this)

{
  MethodDictionary *pMVar1;
  Metaclass *pMVar2;
  __node_base *p_Var3;
  OopRef method;
  OopRef selector;
  anon_union_8_4_0eb573b0_for_Oop_0 local_58 [4];
  anon_union_8_4_0eb573b0_for_Oop_0 local_38 [4];
  
  pMVar1 = MethodDictionary::basicNativeNew(this->context);
  pMVar2 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
  (pMVar2->super_ClassDescription).super_Behavior.methodDict = pMVar1;
  OopRef::OopRef((OopRef *)local_38,this->context);
  OopRef::OopRef((OopRef *)local_58,this->context);
  p_Var3 = &(this->classSidePrimitiveMethods)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    local_38[0] = (anon_union_8_4_0eb573b0_for_Oop_0)
                  ByteSymbol::fromNative(this->context,(string *)(p_Var3 + 1));
    local_58[0].header =
         (ObjectHeader *)NativeMethod::create(this->context,(PrimitiveFunction)p_Var3[5]._M_nxt);
    pMVar2 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
    MethodDictionary::internalAtPut
              ((pMVar2->super_ClassDescription).super_Behavior.methodDict,this->context,
               (Oop)local_38[0],(Oop)local_58[0]);
  }
  OopRef::~OopRef((OopRef *)local_58);
  OopRef::~OopRef((OopRef *)local_38);
  return;
}

Assistant:

void ClassBuilder::createMetaclassMethodDict()
{
    metaclass->methodDict = MethodDictionary::basicNativeNew(context);
    OopRef selector(context);
    OopRef method(context);
    for(auto &selectorAndMethod : classSidePrimitiveMethods)
    {
        selector = ByteSymbol::fromNative(context, selectorAndMethod.first);
        method = Oop::fromPointer(NativeMethod::create(context, selectorAndMethod.second));
        metaclass->methodDict->atPut(context, selector.oop, method.oop);
    }
}